

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void am_generalize_match_double_click_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *list_value;
  ostream *this;
  undefined1 local_48 [8];
  Am_Value_List sel_list;
  Am_Object invoke_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object scroll_menu;
  Am_Object *cmd_local;
  
  scroll_menu.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Owner((Am_Object *)&sel_list.item,(Am_Slot_Flags)&local_18);
  list_value = Am_Object::Get(&local_18,0x171,3);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,list_value);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_48);
  if (bVar1) {
    this = std::operator<<((ostream *)&std::cout," POP UP GENERALIZE MATCH DB\n");
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    Am_Pop_Up_Generalize_Match_DB((Am_Object *)&sel_list.item,(Am_Value_List *)local_48);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_generalize_match_double_click,
                 (Am_Object cmd))
{
  //cmd in inter on scroll_menu on invoke_window
  Am_Object scroll_menu = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object invoke_window = scroll_menu.Get_Owner();
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid()) {
    std::cout << " POP UP GENERALIZE MATCH DB\n" << std::flush;
    Am_Pop_Up_Generalize_Match_DB(invoke_window, sel_list);
  }
}